

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

deflate_allocs * alloc_deflate(zng_stream *strm,int windowBits,int lit_bufsize)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  void *pvVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  deflate_allocs *pdVar10;
  int iVar11;
  
  bVar2 = (byte)windowBits & 0x1f;
  iVar9 = 2 << bVar2;
  iVar11 = (-iVar9 & 0x3eU) + iVar9;
  iVar8 = iVar11 + iVar9;
  iVar8 = (-iVar8 & 0x3eU) + iVar8;
  iVar5 = (-iVar8 & 0x3eU) + iVar8 + 0x20000;
  iVar3 = lit_bufsize * 5 + iVar5;
  iVar3 = (-iVar3 & 0x3fU) + iVar3;
  iVar1 = iVar3 + (-iVar3 & 0xfU);
  pvVar4 = (*strm->zalloc)(strm->opaque,1,(-iVar1 - 0x17f7U & 0x3f) + iVar1 + 0x1877);
  if (pvVar4 == (void *)0x0) {
    pdVar10 = (deflate_allocs *)(ulong)(uint)(0 << bVar2);
  }
  else {
    lVar7 = (ulong)(-(int)pvVar4 & 0x3f) + (long)pvVar4;
    lVar6 = (long)(int)((-iVar3 & 0xfU) + 0x1800 + iVar3);
    pdVar10 = (deflate_allocs *)(lVar7 + lVar6);
    *(void **)(lVar6 + lVar7) = pvVar4;
    *(free_func *)(lVar6 + 8 + lVar7) = strm->zfree;
    *(long *)(lVar6 + 0x18 + lVar7) = lVar7;
    pvVar4 = (void *)(iVar11 + lVar7);
    *(void **)(lVar6 + 0x28 + lVar7) = pvVar4;
    *(long *)(lVar6 + 0x30 + lVar7) = iVar8 + lVar7;
    *(long *)(lVar6 + 0x20 + lVar7) = iVar5 + lVar7;
    *(long *)(lVar6 + 0x10 + lVar7) = iVar3 + lVar7;
    memset(pvVar4,0,(long)iVar9);
  }
  return pdVar10;
}

Assistant:

Z_INTERNAL deflate_allocs* alloc_deflate(PREFIX3(stream) *strm, int windowBits, int lit_bufsize) {
    int curr_size = 0;

    /* Define sizes */
    int window_size = DEFLATE_ADJUST_WINDOW_SIZE((1 << windowBits) * 2);
    int prev_size = (1 << windowBits) * (int)sizeof(Pos);
    int head_size = HASH_SIZE * sizeof(Pos);
    int pending_size = lit_bufsize * LIT_BUFS;
    int state_size = sizeof(deflate_state);
    int alloc_size = sizeof(deflate_allocs);

    /* Calculate relative buffer positions and paddings */
    LOGSZP("window", window_size, PAD_WINDOW(curr_size), PADSZ(curr_size,WINDOW_PAD_SIZE));
    int window_pos = PAD_WINDOW(curr_size);
    curr_size = window_pos + window_size;

    LOGSZP("prev", prev_size, PAD_64(curr_size), PADSZ(curr_size,64));
    int prev_pos = PAD_64(curr_size);
    curr_size = prev_pos + prev_size;

    LOGSZP("head", head_size, PAD_64(curr_size), PADSZ(curr_size,64));
    int head_pos = PAD_64(curr_size);
    curr_size = head_pos + head_size;

    LOGSZP("pending", pending_size, PAD_64(curr_size), PADSZ(curr_size,64));
    int pending_pos = PAD_64(curr_size);
    curr_size = pending_pos + pending_size;

    LOGSZP("state", state_size, PAD_64(curr_size), PADSZ(curr_size,64));
    int state_pos = PAD_64(curr_size);
    curr_size = state_pos + state_size;

    LOGSZP("alloc", alloc_size, PAD_16(curr_size), PADSZ(curr_size,16));
    int alloc_pos = PAD_16(curr_size);
    curr_size = alloc_pos + alloc_size;

    /* Add 64-1 or 4096-1 to allow window alignment, and round size of buffer up to multiple of 64 */
    int total_size = PAD_64(curr_size + (WINDOW_PAD_SIZE - 1));

    /* Allocate buffer, align to 64-byte cacheline, and zerofill the resulting buffer */
    char *original_buf = (char *)strm->zalloc(strm->opaque, 1, total_size);
    if (original_buf == NULL)
        return NULL;

    char *buff = (char *)HINT_ALIGNED_WINDOW((char *)PAD_WINDOW(original_buf));
    LOGSZPL("Buffer alloc", total_size, PADSZ((uintptr_t)original_buf,WINDOW_PAD_SIZE), PADSZ(curr_size,WINDOW_PAD_SIZE));

    /* Initialize alloc_bufs */
    deflate_allocs *alloc_bufs  = (struct deflate_allocs_s *)(buff + alloc_pos);
    alloc_bufs->buf_start = original_buf;
    alloc_bufs->zfree = strm->zfree;

    /* Assign buffers */
    alloc_bufs->window = (unsigned char *)HINT_ALIGNED_WINDOW(buff + window_pos);
    alloc_bufs->prev = (Pos *)HINT_ALIGNED_64(buff + prev_pos);
    alloc_bufs->head = (Pos *)HINT_ALIGNED_64(buff + head_pos);
    alloc_bufs->pending_buf = (unsigned char *)HINT_ALIGNED_64(buff + pending_pos);
    alloc_bufs->state = (deflate_state *)HINT_ALIGNED_16(buff + state_pos);

    memset((char *)alloc_bufs->prev, 0, prev_size);

    return alloc_bufs;
}